

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

void __thiscall ghc::filesystem::path::append_name(path *this,value_type *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  size_t sVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  path local_40;
  
  sVar2 = (this->_path)._M_string_length;
  if (sVar2 != 0) {
    if ((this->_path)._M_dataplus._M_p[sVar2 - 1] != '/') {
      std::__cxx11::string::push_back((char)this);
    }
    std::__cxx11::string::append((char *)this);
    return;
  }
  sVar3 = strlen(name);
  paVar1 = &local_40._path.field_2;
  local_40._path._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,name,name + sVar3);
  if ((((local_40._path._M_string_length < 3) || (*local_40._path._M_dataplus._M_p != '/')) ||
      (local_40._path._M_dataplus._M_p[1] != '/')) || (local_40._path._M_dataplus._M_p[2] == '/')) {
    _Var4 = std::
            __unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<ghc::filesystem::path::postprocess_path_with_format(ghc::filesystem::path::format)::_lambda(char,char)_2_>>
                      (local_40._path._M_dataplus._M_p,
                       local_40._path._M_dataplus._M_p + local_40._path._M_string_length);
  }
  else {
    _Var4 = std::
            __unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<ghc::filesystem::path::postprocess_path_with_format(ghc::filesystem::path::format)::_lambda(char,char)_1_>>
                      (local_40._path._M_dataplus._M_p + 2,
                       local_40._path._M_dataplus._M_p + local_40._path._M_string_length);
  }
  local_40._path._M_string_length = (long)_Var4._M_current - (long)local_40._path._M_dataplus._M_p;
  *_Var4._M_current = '\0';
  operator/=(this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._path._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._path._M_dataplus._M_p,local_40._path.field_2._M_allocated_capacity + 1
                   );
  }
  return;
}

Assistant:

GHC_INLINE void path::append_name(const value_type* name)
{
    if (_path.empty()) {
        this->operator/=(path(name));
    }
    else {
        if (_path.back() != path::preferred_separator) {
            _path.push_back(path::preferred_separator);
        }
        _path += name;
        check_long_path();
    }
}